

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O2

ion_status_t flat_file_insert(ion_flat_file_t *flat_file,ion_key_t key,ion_value_t value)

{
  byte bVar1;
  char cVar2;
  ulong uVar3;
  long lVar4;
  ion_flat_file_row_t row;
  ion_flat_file_row_t local_50;
  ion_flat_file_row_t local_38;
  
  uVar3 = (ulong)(flat_file->eof_position - flat_file->start_of_data) / flat_file->row_size;
  if ((flat_file->sorted_mode == '\0') || (lVar4 = uVar3 - 1, lVar4 < 0)) {
LAB_00106f17:
    local_38.row_status = '\x01';
    local_38.key = key;
    local_38.value = value;
    bVar1 = flat_file_write_row(flat_file,uVar3,&local_38);
    if (bVar1 == 0) {
      lVar4 = ftell((FILE *)flat_file->data_file);
      flat_file->eof_position = lVar4;
      bVar1 = (lVar4 == -1) << 3;
      uVar3 = (ulong)(lVar4 != -1) << 0x20;
      goto LAB_00106f5a;
    }
  }
  else {
    bVar1 = flat_file_read_row(flat_file,lVar4,&local_50);
    if (bVar1 == 0) {
      cVar2 = (*(flat_file->super).compare)(key,local_50.key,(flat_file->super).record.key_size);
      if (-1 < cVar2) goto LAB_00106f17;
      bVar1 = 0x14;
    }
  }
  uVar3 = 0;
LAB_00106f5a:
  return (ion_status_t)(bVar1 | uVar3);
}

Assistant:

ion_status_t
flat_file_insert(
	ion_flat_file_t *flat_file,
	ion_key_t		key,
	ion_value_t		value
) {
	ion_status_t	status	= ION_STATUS_INITIALIZE;
	ion_err_t		err;
	/* We can assume append-only insert here because our delete operation does a swap replacement, and
	   in sorted mode, we don't allow deletes - so there are no holes to fill. */
	ion_fpos_t insert_loc	= (flat_file->eof_position - flat_file->start_of_data) / flat_file->row_size;

	if (flat_file->sorted_mode) {
		ion_fpos_t			last_record_loc = (flat_file->eof_position - flat_file->start_of_data) / flat_file->row_size - 1;
		ion_flat_file_row_t row;

		if (last_record_loc >= 0) {
			err = flat_file_read_row(flat_file, last_record_loc, &row);

			if (err_ok != err) {
				status.error = err;
				return status;
			}

			if (flat_file->super.compare(key, row.key, flat_file->super.record.key_size) < 0) {
				status.error = err_sorted_order_violation;
				return status;
			}
		}
	}

	err = flat_file_write_row(flat_file, insert_loc, &(ion_flat_file_row_t) { ION_FLAT_FILE_STATUS_OCCUPIED, key, value });

	if (err_ok != err) {
		status.error = err;
		return status;
	}

	/* Record new eof position */
	flat_file->eof_position = ftell(flat_file->data_file);

	if (-1 == flat_file->eof_position) {
		status.error = err_file_read_error;
		return status;
	}

	status.error	= err_ok;
	status.count	= 1;
	return status;
}